

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_fractional.c
# Opt level: O2

void WebRtcSpl_Resample48khzTo32khz(int32_t *In,int32_t *Out,size_t K)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  size_t sVar9;
  
  for (sVar9 = 0; K != sVar9; sVar9 = sVar9 + 1) {
    Out[sVar9 * 2] =
         In[7] * 0xde + 0x4000 +
         In[6] * 0x1b9 + In[5] * -0xec7 + In[4] * 0x3267 +
         In[3] * 0x5af5 + In[2] * 0x43f + In[1] * -0x802 + *In * 0x30a;
    piVar1 = In + 1;
    piVar2 = In + 2;
    piVar3 = In + 3;
    piVar4 = In + 4;
    piVar5 = In + 5;
    piVar6 = In + 6;
    piVar7 = In + 7;
    piVar8 = In + 8;
    In = In + 3;
    Out[sVar9 * 2 + 1] =
         *piVar8 * 0x30a + 0x4000 +
         *piVar7 * -0x802 + *piVar6 * 0x43f + *piVar5 * 0x5af5 +
         *piVar4 * 0x3267 + *piVar3 * -0xec7 + *piVar2 * 0x1b9 + *piVar1 * 0xde;
  }
  return;
}

Assistant:

void WebRtcSpl_Resample48khzTo32khz(const int32_t *In, int32_t *Out, size_t K)
{
    /////////////////////////////////////////////////////////////
    // Filter operation:
    //
    // Perform resampling (3 input samples -> 2 output samples);
    // process in sub blocks of size 3 samples.
    int32_t tmp;
    size_t m;

    for (m = 0; m < K; m++)
    {
        tmp = 1 << 14;
        tmp += kCoefficients48To32[0][0] * In[0];
        tmp += kCoefficients48To32[0][1] * In[1];
        tmp += kCoefficients48To32[0][2] * In[2];
        tmp += kCoefficients48To32[0][3] * In[3];
        tmp += kCoefficients48To32[0][4] * In[4];
        tmp += kCoefficients48To32[0][5] * In[5];
        tmp += kCoefficients48To32[0][6] * In[6];
        tmp += kCoefficients48To32[0][7] * In[7];
        Out[0] = tmp;

        tmp = 1 << 14;
        tmp += kCoefficients48To32[1][0] * In[1];
        tmp += kCoefficients48To32[1][1] * In[2];
        tmp += kCoefficients48To32[1][2] * In[3];
        tmp += kCoefficients48To32[1][3] * In[4];
        tmp += kCoefficients48To32[1][4] * In[5];
        tmp += kCoefficients48To32[1][5] * In[6];
        tmp += kCoefficients48To32[1][6] * In[7];
        tmp += kCoefficients48To32[1][7] * In[8];
        Out[1] = tmp;

        // update pointers
        In += 3;
        Out += 2;
    }
}